

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_fail.cpp
# Opt level: O2

void __thiscall tst_qpromise_fail::baseClass(tst_qpromise_fail *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar3;
  bool bVar4;
  PromiseData<int> *pPVar5;
  QPromiseReject<int> *in_R8;
  PromiseResolver<int> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_1a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_1a0;
  PromiseResolver<int> resolver_1;
  QPromiseBase<int> local_180;
  _Any_data local_170;
  QString *local_160;
  QPromiseBase<int> local_150;
  QPromiseBase<int> local_140;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_130;
  QPromiseBase<int> local_128;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_118;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_f0;
  QPromise<int> p;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  QString error;
  PromiseResolver<int> resolver;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  QPromiseBase<int> local_50;
  function<void_(const_int_&)> local_40;
  
  std::out_of_range::out_of_range((out_of_range *)local_170._M_pod_data,"foo");
  QtPromise::QPromiseBase<int>::reject<std::out_of_range>
            (&p.super_QPromiseBase<int>,(out_of_range *)local_170._M_pod_data);
  std::out_of_range::~out_of_range((out_of_range *)local_170._M_pod_data);
  error.d.size = 0;
  error.d.d = (Data *)0x0;
  error.d.ptr = (char16_t *)0x0;
  local_150._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f870;
  pPVar5 = (PromiseData<int> *)operator_new(0x68);
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar5);
  LOCK();
  pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011f8d0;
  local_150.m_d.d = pPVar5;
  local_118.super__Function_base._M_functor._8_8_ = pPVar5;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_118);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_118);
  QVar2 = p.super_QPromiseBase<int>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_180._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_180._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  local_d8._M_unused._0_8_ = resolver.m_d.d;
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            (&local_40,(PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_d8,
             (QPromiseResolve<int> *)&local_180,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  QVar2 = p.super_QPromiseBase<int>.m_d;
  local_170._M_unused._M_object = local_d8._M_unused._M_object;
  if ((Data *)local_d8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_d8._M_unused._0_8_ = *local_d8._M_unused._M_object + 1;
    UNLOCK();
  }
  local_170._8_8_ = local_180._vptr_QPromiseBase;
  if ((Data *)local_180._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_160 = &error;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_170._M_unused._M_object;
  if ((Data *)local_170._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_170._M_unused._0_8_ = *local_170._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_170._8_8_;
  if ((Data *)local_170._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
    UNLOCK();
  }
  *(QString **)((long)local_78._M_unused._0_8_ + 0x10) = local_160;
  pcStack_60 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseCatcher<int,tst_qpromise_fail::baseClass()::$_0,std::runtime_error_const&>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_qpromise_fail::baseClass()::$_0_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_170._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &local_180);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&local_d8
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_150._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f8d0;
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f870;
  pPVar5 = (PromiseData<int> *)operator_new(0x68);
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar5);
  LOCK();
  pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011f8d0;
  local_140.m_d.d = pPVar5;
  local_118.super__Function_base._M_functor._8_8_ = pPVar5;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&local_118);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_118);
  QVar2.d = local_150.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_180._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_180._vptr_QPromiseBase = (_func_int **)resolver_1;
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  if ((Data *)local_180._vptr_QPromiseBase == (Data *)0x0) {
    local_1a0.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_180._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_180._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_1a0.d = (Data *)local_180._vptr_QPromiseBase;
  }
  local_1a8.d = (Data *)0x0;
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_int_&)> *)&resolver,
             (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_180,
             (QPromiseResolve<int> *)&local_1a0,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&resolver);
  std::_Function_base::~_Function_base((_Function_base *)&resolver);
  QVar2.d = local_150.m_d.d;
  local_170._M_unused._M_object = local_180._vptr_QPromiseBase;
  if ((Data *)local_180._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_170._8_8_ = local_1a0.d;
  if (local_1a0.d != (Data *)0x0) {
    LOCK();
    ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_160 = &error;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = operator_new(0x18);
  *(void **)local_d8._M_unused._0_8_ = local_170._M_unused._M_object;
  if ((Data *)local_170._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_170._M_unused._0_8_ = *local_170._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = local_170._8_8_;
  if ((Data *)local_170._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
    UNLOCK();
  }
  *(QString **)((long)local_d8._M_unused._0_8_ + 0x10) = local_160;
  pcStack_c0 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<int,tst_qpromise_fail::baseClass()::$_1,std::logic_error_const&>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_qpromise_fail::baseClass()::$_1_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_170._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &local_180);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f8d0;
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(local_150.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(local_150.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f870;
  pPVar5 = (PromiseData<int> *)operator_new(0x68);
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0
  ;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(pPVar5);
  LOCK();
  pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_180._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f8d0;
  local_180.m_d.d = pPVar5;
  local_128.m_d.d = pPVar5;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_2,(QPromise<int> *)&local_180);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_180);
  QVar2.d = local_140.m_d.d;
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_1a0.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_1a0 = resolver_2.m_d.d;
  }
  local_1a8.d = (Data *)0x0;
  if (local_1a0.d == (Data *)0x0) {
    local_f0.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_f0.d = local_1a0.d;
  }
  local_130.d = (Data *)0x0;
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_int_&)> *)&local_170,
             (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_1a0,
             (QPromiseResolve<int> *)&local_f0,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_170);
  std::_Function_base::~_Function_base((_Function_base *)&local_170);
  QVar3.d = local_f0.d;
  QVar2.d = local_140.m_d.d;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_1a0.d;
  if (local_1a0.d != (Data *)0x0) {
    LOCK();
    ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_f0.d != (Data *)0x0) {
    LOCK();
    ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_118.super__Function_base._M_functor._8_8_ = 0;
  local_118.super__Function_base._M_manager = (_Manager_type)0x0;
  local_118._M_invoker = (_Invoker_type)0x0;
  local_118.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_118.super__Function_base._M_functor._M_unused._0_8_)->d = (Data *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_118.super__Function_base._M_functor._M_unused._0_8_ + 8))->d = QVar3.d;
  if (QVar3.d != (Data *)0x0) {
    LOCK();
    ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_118.super__Function_base._M_functor._M_unused._0_8_ + 0x10))->d = (Data *)&error;
  local_118._M_invoker =
       std::
       _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
       ::_M_invoke;
  local_118.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
       ::_M_manager;
  QtPromisePrivate::PromiseCatcher<int,tst_qpromise_fail::baseClass()::$_2,std::exception_const&>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_qpromise_fail::baseClass()::$_2_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&resolver_1);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_118);
  std::_Function_base::~_Function_base(&local_118.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_f0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_130);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f8d0;
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(local_140.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(local_140.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  QtPromise::QPromiseBase<int>::wait(&local_50,&local_128);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_50);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_128);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_140);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_150);
  QString::QString((QString *)&resolver_1,"foo1");
  QTest::qCompare(&error,(QString *)&resolver_1,"error","QString{\"foo1\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_fail.cpp"
                  ,0x71);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver_1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&error.d);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_qpromise_fail::baseClass()
{
    // http://en.cppreference.com/w/cpp/error/exception
    auto p = QtPromise::QPromise<int>::reject(std::out_of_range("foo"));

    QString error;
    p.fail([&](const std::runtime_error& e) {
         error += QString{e.what()} + "0";
         return -1;
     })
        .fail([&](const std::logic_error& e) {
            error += QString{e.what()} + "1";
            return -1;
        })
        .fail([&](const std::exception& e) {
            error += QString{e.what()} + "2";
            return -1;
        })
        .wait();

    QCOMPARE(error, QString{"foo1"});
}